

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object_Advanced __thiscall
Am_Object_Advanced::Get_Slot_Locale(Am_Object_Advanced *this,Am_Slot_Key key)

{
  Am_Slot_Data *pAVar1;
  Am_Slot_Key in_DX;
  undefined6 in_register_00000032;
  Am_Slot_Data *slot;
  Am_Slot_Key key_local;
  Am_Object_Advanced *this_local;
  
  if (*(long *)CONCAT62(in_register_00000032,key) == 0) {
    Am_Error("** Get_Slot_Locale called on a (0L) object.");
  }
  pAVar1 = Am_Object_Data::find_slot(*(Am_Object_Data **)CONCAT62(in_register_00000032,key),in_DX);
  if ((pAVar1 == (Am_Slot_Data *)0x0) || (pAVar1->context == (Am_Object_Data *)0x0)) {
    Am_Object_Advanced(this,(Am_Object_Data *)0x0);
  }
  else {
    Am_Wrapper::Note_Reference(&pAVar1->context->super_Am_Wrapper);
    Am_Object_Advanced(this,pAVar1->context);
  }
  return (Am_Object_Advanced)(Am_Object)this;
}

Assistant:

Am_Object_Advanced
Am_Object_Advanced::Get_Slot_Locale(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("** Get_Slot_Locale called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (slot && slot->context) {
    slot->context->Note_Reference();
    return slot->context;
  } else
    return Am_Object_Advanced(nullptr);
}